

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O0

CBlock * CreateGenesisBlock(uint32_t nTime,uint32_t nNonce,uint32_t nBits,int32_t nVersion,
                           CAmount *genesisReward)

{
  long lVar1;
  span<const_std::byte,_18446744073709551615UL> b;
  CBlock *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  char *pszTimestamp;
  int32_t in_stack_00000070;
  CAmount *in_stack_00000078;
  CScript genesisOutputScript;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  array<std::byte,_65UL> *in_stack_fffffffffffffef0;
  span<const_std::byte,_18446744073709551615UL> *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff10;
  undefined4 uVar2;
  opcodetype opcode;
  uint32_t in_stack_ffffffffffffff74;
  uint32_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  CScript *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  
  uVar2 = SUB84(in_RDI,0);
  opcode = (opcodetype)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<131UL>___4,_103,_138,_253,_176,_254,_85,_72,_39,_25,_______>
            ();
  std::span<const_std::byte,_18446744073709551615UL>::span<std::byte,_65UL>
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  b._M_extent._M_extent_value._0_4_ = uVar2;
  b._M_ptr = (pointer)in_stack_ffffffffffffff10;
  b._M_extent._M_extent_value._4_4_ = opcode;
  CScript::operator<<((CScript *)in_stack_fffffffffffffef8,b);
  CScript::operator<<((CScript *)in_RDI,opcode);
  CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   (CScript *)0x65c916);
  CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  CreateGenesisBlock(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                     in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_00000070,
                     in_stack_00000078);
  CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffeec,in_R8D));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static CBlock CreateGenesisBlock(uint32_t nTime, uint32_t nNonce, uint32_t nBits, int32_t nVersion, const CAmount& genesisReward)
{
    const char* pszTimestamp = "The Times 03/Jan/2009 Chancellor on brink of second bailout for banks";
    const CScript genesisOutputScript = CScript() << "04678afdb0fe5548271967f1a67130b7105cd6a828e03909a67962e0ea1f61deb649f6bc3f4cef38c4f35504e51ec112de5c384df7ba0b8d578a4c702b6bf11d5f"_hex << OP_CHECKSIG;
    return CreateGenesisBlock(pszTimestamp, genesisOutputScript, nTime, nNonce, nBits, nVersion, genesisReward);
}